

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O0

AggregateFunctionSet * duckdb::ArgMinFun::GetFunctions(void)

{
  AggregateFunctionSet *in_RDI;
  AggregateFunctionSet *fun;
  AggregateFunctionSet *in_stack_00000170;
  AggregateFunctionSet *in_stack_00000380;
  
  duckdb::AggregateFunctionSet::AggregateFunctionSet(in_RDI);
  AddArgMinMaxFunctions<duckdb::LessThan,true,(duckdb::OrderType)2>(in_stack_00000170);
  AddArgMinMaxNFunction<duckdb::LessThan>(in_stack_00000380);
  return in_RDI;
}

Assistant:

AggregateFunctionSet ArgMinFun::GetFunctions() {
	AggregateFunctionSet fun;
	AddArgMinMaxFunctions<LessThan, true, OrderType::ASCENDING>(fun);
	AddArgMinMaxNFunction<LessThan>(fun);
	return fun;
}